

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigRetMin.c
# Opt level: O0

Aig_Man_t * Saig_ManRetimeDupForward(Aig_Man_t *p,Vec_Ptr_t *vCut)

{
  Vec_Ptr_t *p_00;
  int iVar1;
  Aig_Man_t *p_01;
  char *pcVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  void *pvVar5;
  int local_3c;
  int i;
  Aig_Obj_t *pObjLo;
  Aig_Obj_t *pObjLi;
  Aig_Obj_t *pObj;
  Aig_Man_t *pNew;
  Vec_Ptr_t *vCut_local;
  Aig_Man_t *p_local;
  
  iVar1 = Aig_ManObjNumMax(p);
  p_01 = Aig_ManStart(iVar1);
  pcVar2 = Abc_UtilStrsav(p->pName);
  p_01->pName = pcVar2;
  pcVar2 = Abc_UtilStrsav(p->pSpec);
  p_01->pSpec = pcVar2;
  iVar1 = Vec_PtrSize(vCut);
  p_01->nRegs = iVar1;
  p_01->nTruePis = p->nTruePis;
  p_01->nTruePos = p->nTruePos;
  Aig_ManCleanData(p);
  pAVar3 = Aig_ManConst1(p_01);
  pAVar4 = Aig_ManConst1(p);
  (pAVar4->field_5).pData = pAVar3;
  for (local_3c = 0; iVar1 = Saig_ManPiNum(p), local_3c < iVar1; local_3c = local_3c + 1) {
    pvVar5 = Vec_PtrEntry(p->vCis,local_3c);
    pAVar3 = Aig_ObjCreateCi(p_01);
    *(Aig_Obj_t **)((long)pvVar5 + 0x28) = pAVar3;
  }
  for (local_3c = 0; iVar1 = Vec_PtrSize(vCut), local_3c < iVar1; local_3c = local_3c + 1) {
    pvVar5 = Vec_PtrEntry(vCut,local_3c);
    pAVar3 = Aig_ObjCreateCi(p_01);
    pAVar3 = Aig_NotCond(pAVar3,(uint)(*(ulong *)((long)pvVar5 + 0x18) >> 3) & 1);
    *(Aig_Obj_t **)((long)pvVar5 + 0x28) = pAVar3;
  }
  for (local_3c = 0; iVar1 = Vec_PtrSize(p->vCos), local_3c < iVar1; local_3c = local_3c + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,local_3c);
    pAVar3 = Aig_ObjFanin0(pAVar3);
    Saig_ManRetimeDup_rec(p_01,pAVar3);
  }
  for (local_3c = 0; iVar1 = Saig_ManPoNum(p), local_3c < iVar1; local_3c = local_3c + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,local_3c);
    pAVar3 = Aig_ObjChild0Copy(pAVar3);
    Aig_ObjCreateCo(p_01,pAVar3);
  }
  for (local_3c = 0; iVar1 = Saig_ManRegNum(p), local_3c < iVar1; local_3c = local_3c + 1) {
    p_00 = p->vCos;
    iVar1 = Saig_ManPoNum(p);
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p_00,local_3c + iVar1);
    pAVar4 = Aig_ObjChild0Copy(pAVar3);
    (pAVar3->field_5).pData = pAVar4;
  }
  for (local_3c = 0; iVar1 = Saig_ManRegNum(p), local_3c < iVar1; local_3c = local_3c + 1) {
    pAVar3 = Saig_ManLi(p,local_3c);
    pAVar4 = Saig_ManLo(p,local_3c);
    pAVar4->field_5 = pAVar3->field_5;
  }
  for (local_3c = 0; iVar1 = Vec_PtrSize(vCut), local_3c < iVar1; local_3c = local_3c + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(vCut,local_3c);
    iVar1 = Aig_ObjIsNode(pAVar3);
    if (iVar1 != 0) {
      (pAVar3->field_5).pData = (void *)0x0;
    }
  }
  for (local_3c = 0; iVar1 = Vec_PtrSize(vCut), local_3c < iVar1; local_3c = local_3c + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(vCut,local_3c);
    Saig_ManRetimeDup_rec(p_01,pAVar3);
    pAVar3 = Aig_NotCond((Aig_Obj_t *)(pAVar3->field_5).pData,
                         (uint)(*(ulong *)&pAVar3->field_0x18 >> 3) & 1);
    Aig_ObjCreateCo(p_01,pAVar3);
  }
  Aig_ManCleanup(p_01);
  return p_01;
}

Assistant:

Aig_Man_t * Saig_ManRetimeDupForward( Aig_Man_t * p, Vec_Ptr_t * vCut )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj, * pObjLi, * pObjLo;
    int i;
    // mark the cones under the cut
//    assert( Vec_PtrSize(vCut) == Saig_ManRetimeCountCut(p, vCut) );
    // create the new manager
    pNew = Aig_ManStart( Aig_ManObjNumMax(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->nRegs = Vec_PtrSize(vCut);
    pNew->nTruePis = p->nTruePis;
    pNew->nTruePos = p->nTruePos;
    // create the true PIs
    Aig_ManCleanData( p );
    Aig_ManConst1(p)->pData = Aig_ManConst1(pNew);
    Saig_ManForEachPi( p, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pNew );
    // create the registers
    Vec_PtrForEachEntry( Aig_Obj_t *, vCut, pObj, i )
        pObj->pData = Aig_NotCond( Aig_ObjCreateCi(pNew), pObj->fPhase );
    // duplicate logic above the cut
    Aig_ManForEachCo( p, pObj, i )
        Saig_ManRetimeDup_rec( pNew, Aig_ObjFanin0(pObj) );
    // create the true POs
    Saig_ManForEachPo( p, pObj, i )
        Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    // remember value in LI
    Saig_ManForEachLi( p, pObj, i )
        pObj->pData = Aig_ObjChild0Copy(pObj);
    // transfer values from the LIs to the LOs
    Saig_ManForEachLiLo( p, pObjLi, pObjLo, i )
        pObjLo->pData = pObjLi->pData;
    // erase the data values on the internal nodes of the cut
    Vec_PtrForEachEntry( Aig_Obj_t *, vCut, pObj, i )
        if ( Aig_ObjIsNode(pObj) )
            pObj->pData = NULL;
    // duplicate logic below the cut
    Vec_PtrForEachEntry( Aig_Obj_t *, vCut, pObj, i )
    {
        Saig_ManRetimeDup_rec( pNew, pObj );
        Aig_ObjCreateCo( pNew, Aig_NotCond((Aig_Obj_t *)pObj->pData, pObj->fPhase) );
    }
    Aig_ManCleanup( pNew );
    return pNew;
}